

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::getCore(Federate *this,FederateInfo *fedInfo)

{
  milliseconds delay;
  string_view message;
  string_view message_00;
  string_view configureString;
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  char *__str;
  long in_RSI;
  long in_RDI;
  RegistrationFailure *anon_var_0;
  size_type loc;
  string cname;
  size_type in_stack_00000f68;
  shared_ptr<helics::Core> *in_stack_fffffffffffffb98;
  shared_ptr<helics::Core> *__r;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  undefined4 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  undefined4 in_stack_fffffffffffffbb8;
  CoreType in_stack_fffffffffffffbbc;
  undefined1 *puVar5;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  char *in_stack_fffffffffffffbc8;
  FederateInfo *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe8;
  CoreType in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  shared_ptr<helics::Core> local_3f0;
  CoreType in_stack_fffffffffffffc2c;
  string_view in_stack_fffffffffffffc30;
  string_view in_stack_fffffffffffffc40;
  undefined1 local_390 [32];
  __sv_type local_370;
  __sv_type local_360;
  rep local_340;
  basic_string_view<char,_std::char_traits<char>_> local_328;
  CoreType in_stack_fffffffffffffcf4;
  string_view in_stack_fffffffffffffcf8;
  string_view in_stack_fffffffffffffd08;
  __sv_type local_2a8;
  __sv_type local_220;
  __sv_type local_210;
  format_args in_stack_fffffffffffffe00;
  string_view in_stack_fffffffffffffe10;
  undefined1 local_1d0 [32];
  char *local_1b0;
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [32];
  size_type local_180;
  undefined1 local_168 [32];
  _Alloc_hider local_148;
  size_type local_140;
  undefined1 local_138 [48];
  long local_108;
  undefined1 local_f8 [32];
  undefined8 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  size_type sStack_c0;
  undefined1 *local_b0;
  long local_a8;
  char *local_a0;
  size_type sStack_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  pointer pcStack_50;
  undefined1 *local_48;
  undefined1 *local_40;
  char *local_38;
  pointer pcStack_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_108 = in_RSI;
  bVar1 = FederateInfo::checkFlagProperty
                    ((FederateInfo *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                     in_stack_fffffffffffffbb4,SUB41((uint)in_stack_fffffffffffffbb0 >> 0x18,0));
  *(bool *)(in_RDI + 0xe) = bVar1;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x18));
  if (!bVar1) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33d39a);
    if (bVar1) {
      if ((*(byte *)(local_108 + 0x58) & 1) == 0) {
        CoreFactory::findJoinableCoreOfType(in_stack_fffffffffffffbec);
        std::shared_ptr<helics::Core>::operator=
                  ((shared_ptr<helics::Core> *)
                   CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                   in_stack_fffffffffffffb98);
        std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x33d3ec);
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x18));
      if (!bVar1) {
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x33d410);
        if (bVar1) {
          generateFullCoreInitString_abi_cxx11_((FederateInfo *)&stack0xfffffffffffffd38);
          local_2a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          configureString._M_len._4_4_ = in_stack_fffffffffffffbc4;
          configureString._M_len._0_4_ = in_stack_fffffffffffffbc0;
          configureString._M_str = in_stack_fffffffffffffbc8;
          CoreFactory::create(in_stack_fffffffffffffbbc,configureString);
          std::shared_ptr<helics::Core>::operator=
                    ((shared_ptr<helics::Core> *)
                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                     in_stack_fffffffffffffb98);
          std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x33da45);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
        }
        else {
          local_148._M_p = "{}_core_{}";
          local_140 = 10;
          gmlc::utilities::randomString_abi_cxx11_(in_stack_00000f68);
          local_90 = local_138;
          local_a0 = local_148._M_p;
          sStack_98 = local_140;
          local_c8 = local_148._M_p;
          sStack_c0 = local_140;
          local_b0 = local_168;
          local_a8 = in_RDI + 0x78;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)
                     CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                     in_stack_fffffffffffffba8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)
                     CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                     in_stack_fffffffffffffba8);
          local_8 = &local_d8;
          local_10 = local_f8;
          local_d8 = 0xdd;
          local_d0 = local_10;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffe10,in_stack_fffffffffffffe00);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          local_180 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                                 (char *)CONCAT44(in_stack_fffffffffffffbbc,
                                                  in_stack_fffffffffffffbb8),
                                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
          if (local_180 != 0xffffffffffffffff) {
            local_1b0 = "{}_core_{}";
            local_1a8._M_p = (pointer)0xa;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                   CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (size_type)in_stack_fffffffffffffba8);
            gmlc::utilities::randomString_abi_cxx11_(in_stack_00000f68);
            local_28 = local_1a0;
            local_38 = local_1b0;
            pcStack_30 = local_1a8._M_p;
            local_40 = local_1d0;
            local_48 = &stack0xfffffffffffffe10;
            local_58 = local_1b0;
            pcStack_50 = local_1a8._M_p;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)
                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       in_stack_fffffffffffffba8);
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)
                       CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       in_stack_fffffffffffffba8);
            local_18 = &local_68;
            local_20 = local_88;
            local_68 = 0xdd;
            local_60 = local_20;
            ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffe10,in_stack_fffffffffffffe00);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          }
          local_210 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          generateFullCoreInitString_abi_cxx11_(in_stack_fffffffffffffbd8);
          local_220 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          CoreFactory::create(in_stack_fffffffffffffcf4,in_stack_fffffffffffffd08,
                              in_stack_fffffffffffffcf8);
          std::shared_ptr<helics::Core>::operator=
                    ((shared_ptr<helics::Core> *)
                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                     in_stack_fffffffffffffb98);
          std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x33d855);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
        }
      }
    }
    else if ((*(byte *)(local_108 + 0x58) & 1) == 0) {
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      generateFullCoreInitString_abi_cxx11_(in_stack_fffffffffffffbd8);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      CoreFactory::FindOrCreate
                (in_stack_fffffffffffffc2c,in_stack_fffffffffffffc40,in_stack_fffffffffffffc30);
      std::shared_ptr<helics::Core>::operator=
                ((shared_ptr<helics::Core> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                 in_stack_fffffffffffffb98);
      std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x33db48);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      peVar3 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x33db63);
      uVar2 = (*peVar3->_vptr_Core[0xb])();
      if ((uVar2 & 1) == 0) {
        this_00 = &local_328;
        std::shared_ptr<helics::Core>::shared_ptr
                  ((shared_ptr<helics::Core> *)
                   CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                   in_stack_fffffffffffffb98);
        std::shared_ptr<helics::Core>::operator=
                  ((shared_ptr<helics::Core> *)
                   CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                   in_stack_fffffffffffffb98);
        std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x33dba7);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (this_00,(char *)in_stack_fffffffffffffba8);
        message._M_str._0_4_ = (int)this_00;
        message._M_len = (size_t)in_stack_fffffffffffffba8;
        message._M_str._4_4_ = (int)((ulong)this_00 >> 0x20);
        logWarningMessage((Federate *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                          message);
        local_340 = (rep)ms<(char)50,(char)48,(char)48>();
        delay.__r._4_4_ = in_stack_fffffffffffffba4;
        delay.__r._0_4_ = in_stack_fffffffffffffba0;
        CoreFactory::cleanUpCores(delay);
        uVar4 = *(undefined4 *)(local_108 + 0x50);
        local_360 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
        puVar5 = local_390;
        generateFullCoreInitString_abi_cxx11_(in_stack_fffffffffffffbd8);
        local_370 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
        CoreFactory::FindOrCreate
                  (in_stack_fffffffffffffc2c,in_stack_fffffffffffffc40,in_stack_fffffffffffffc30);
        std::shared_ptr<helics::Core>::operator=
                  ((shared_ptr<helics::Core> *)
                   CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                   in_stack_fffffffffffffb98);
        std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x33dca4);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
        peVar3 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x33dcbf);
        uVar2 = (*peVar3->_vptr_Core[0xb])();
        if ((uVar2 & 1) == 0) {
          __str = (char *)__cxa_allocate_exception(0x28);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (this_00,__str);
          message_00._M_str._0_4_ = in_stack_fffffffffffffbc0;
          message_00._M_len = (size_t)puVar5;
          message_00._M_str._4_4_ = uVar4;
          RegistrationFailure::RegistrationFailure((RegistrationFailure *)this_00,message_00);
          __cxa_throw(__str,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure
                     );
        }
      }
    }
    else {
      uVar4 = *(undefined4 *)(local_108 + 0x50);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar4,in_stack_fffffffffffffba0));
      __r = &local_3f0;
      generateFullCoreInitString_abi_cxx11_(in_stack_fffffffffffffbd8);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar4,in_stack_fffffffffffffba0));
      CoreFactory::create(in_stack_fffffffffffffcf4,in_stack_fffffffffffffd08,
                          in_stack_fffffffffffffcf8);
      std::shared_ptr<helics::Core>::operator=
                ((shared_ptr<helics::Core> *)CONCAT44(uVar4,in_stack_fffffffffffffba0),__r);
      std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x33de28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar4,in_stack_fffffffffffffba0));
    }
  }
  return;
}

Assistant:

void Federate::getCore(const FederateInfo& fedInfo)
{
    singleThreadFederate = fedInfo.checkFlagProperty(defs::Flags::SINGLE_THREAD_FEDERATE, false);
    if (coreObject) {
        return;
    }

    if (fedInfo.coreName.empty()) {
        if (!fedInfo.forceNewCore) {
            coreObject = CoreFactory::findJoinableCoreOfType(fedInfo.coreType);
        }
        if (!coreObject) {
            if (!mName.empty()) {
                std::string cname =
                    fmt::format("{}_core_{}", mName, gmlc::utilities::randomString(6));
                auto loc = mName.find("${");
                if (loc != std::string::npos) {
                    cname = fmt::format("{}_core_{}",
                                        mName.substr(0, loc),
                                        gmlc::utilities::randomString(8));
                }
                try {
                    coreObject = CoreFactory::create(fedInfo.coreType,
                                                     cname,
                                                     generateFullCoreInitString(fedInfo));
                }
                catch (const helics::RegistrationFailure&) {
                    // there is a possibility of race condition here in the naming resulting a
                    // failure this catches and reverts to previous naming which is fully randomly
                    // generated
                    coreObject =
                        CoreFactory::create(fedInfo.coreType, generateFullCoreInitString(fedInfo));
                }
            } else {
                coreObject =
                    CoreFactory::create(fedInfo.coreType, generateFullCoreInitString(fedInfo));
            }
        }
    } else {
        if (!fedInfo.forceNewCore) {
            coreObject = CoreFactory::FindOrCreate(fedInfo.coreType,
                                                   fedInfo.coreName,
                                                   generateFullCoreInitString(fedInfo));
            if (!coreObject->isOpenToNewFederates()) {
                coreObject = nullptr;
                logWarningMessage("found core object is not open");
                CoreFactory::cleanUpCores(200ms);
                coreObject = CoreFactory::FindOrCreate(fedInfo.coreType,
                                                       fedInfo.coreName,
                                                       generateFullCoreInitString(fedInfo));
                if (!coreObject->isOpenToNewFederates()) {
                    throw(RegistrationFailure(
                        "Unable to connect to specified core: core is not open to new Federates"));
                }
            }
        } else {
            coreObject = CoreFactory::create(fedInfo.coreType,
                                             fedInfo.coreName,
                                             generateFullCoreInitString(fedInfo));
        }
    }
}